

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int rludecomp(double *A,int M,int N,int *ipiv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double temp;
  double mval;
  double mult;
  double ld;
  int local_38;
  int tempi;
  int mind;
  int c2;
  int c1;
  int l;
  int j;
  int k;
  int *ipiv_local;
  int N_local;
  int M_local;
  double *A_local;
  
  for (l = 0; l < M; l = l + 1) {
    ipiv[l] = (int)(double)l;
  }
  if (N < M) {
    for (l = 0; l < N; l = l + 1) {
      temp = ABS(A[l * N + l]);
      local_38 = l;
      c1 = l;
      while (c1 = c1 + 1, c1 < M) {
        if (temp < ABS(A[c1 * N + l])) {
          temp = A[c1 * N + l];
          local_38 = c1;
        }
      }
      if (local_38 != l) {
        iVar3 = ipiv[local_38];
        ipiv[local_38] = ipiv[l];
        ipiv[l] = iVar3;
        for (c1 = 0; c1 < N; c1 = c1 + 1) {
          dVar1 = A[l * N + c1];
          A[(long)(l * N) + (long)c1] = A[(long)(local_38 * N) + (long)c1];
          A[(long)(local_38 * N) + (long)c1] = dVar1;
        }
      }
      dVar1 = A[l * N + l];
      if (((dVar1 != 0.0) || (NAN(dVar1))) && (c1 = l, l < N)) {
        while (c1 = c1 + 1, c1 < M) {
          iVar3 = c1 * N + l;
          dVar2 = A[iVar3];
          A[iVar3] = dVar2 / dVar1;
          c2 = l;
          while (c2 = c2 + 1, c2 < N) {
            iVar3 = c1 * N + c2;
            A[iVar3] = -(dVar2 / dVar1) * A[l * N + c2] + A[iVar3];
          }
        }
      }
    }
  }
  else if (M < N) {
    for (l = 0; l < M + -1; l = l + 1) {
      temp = ABS(A[l * N + l]);
      local_38 = l;
      c1 = l;
      while (c1 = c1 + 1, c1 < M) {
        if (temp < ABS(A[c1 * N + l])) {
          temp = A[c1 * N + l];
          local_38 = c1;
        }
      }
      if (local_38 != l) {
        iVar3 = ipiv[local_38];
        ipiv[local_38] = ipiv[l];
        ipiv[l] = iVar3;
        for (c1 = 0; c1 < N; c1 = c1 + 1) {
          dVar1 = A[l * N + c1];
          A[(long)(l * N) + (long)c1] = A[(long)(local_38 * N) + (long)c1];
          A[(long)(local_38 * N) + (long)c1] = dVar1;
        }
      }
      dVar1 = A[l * N + l];
      c1 = l;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        while (c1 = c1 + 1, c1 < M) {
          iVar3 = c1 * N + l;
          dVar2 = A[iVar3];
          A[iVar3] = dVar2 / dVar1;
          c2 = l;
          while (c2 = c2 + 1, c2 < N) {
            iVar3 = c1 * N + c2;
            A[iVar3] = -(dVar2 / dVar1) * A[l * N + c2] + A[iVar3];
          }
        }
      }
    }
  }
  else if (M == N) {
    pludecomp(A,N,ipiv);
  }
  return 0;
}

Assistant:

int rludecomp(double *A, int M, int N, int *ipiv) {
	int k, j, l, c1, c2, mind, tempi;
	double ld, mult, mval, temp;


	for (k = 0; k < M; ++k)
		ipiv[k] = (double) k;

	if (M > N) {
		for (k = 0; k < N; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0. && k < N) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M < N) {
		for (k = 0; k < M-1; ++k) {
			mval = fabs(A[k*N + k]);
			mind = k;
			for (j = k + 1; j < M; ++j) {
				if (mval < fabs(A[j*N + k])) {
					mval = A[j*N + k];
					mind = j;
				}
			}

			if (mind != k) {
				c1 = k *N;
				c2 = mind * N;
				tempi = ipiv[mind];
				ipiv[mind] = ipiv[k];
				ipiv[k] = tempi;
				for (j = 0; j < N; j++) {
					temp = A[c1 + j];
					*(A + c1 + j) = *(A + c2 + j);
					*(A + c2 + j) = temp;
				}
			}

			c2 = k*N;
			ld = A[c2 + k];
			if (ld != 0.) {
				for (j = k + 1; j < M; ++j) {
					c1 = j*N;
					mult = A[c1 + k] /= ld;
					//printf("\n k %d j %d mult %f \n",k,j,mult);
					for (l = k + 1; l < N; ++l) {
						A[c1 + l] -= mult * A[c2 + l];
					}
				}
			}
		}
	}
	else if (M == N) {
		pludecomp(A,N,ipiv);
	}

	//mdisplay(ipiv, 1, M);

	return 0;

	
}